

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O0

void writeTiledRgbaONE1(char *fileName,Rgba *pixels,int width,int height,int tileWidth,
                       int tileHeight)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  ulong in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  TiledRgbaOutputFile out;
  Vec2<float> local_40;
  Rgba local_38 [5];
  ulong local_10;
  
  local_10 = in_RSI;
  Imath_3_2::Vec2<float>::Vec2(&local_40,0.0,0.0);
  uVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,local_38,in_RDI,in_EDX,in_ECX,in_R8D,in_R9D,0,0,0xf,
             &local_40,0,3,uVar1);
  Imf_3_4::TiledRgbaOutputFile::setFrameBuffer(local_38,local_10,1);
  iVar2 = Imf_3_4::TiledRgbaOutputFile::numXTiles((int)local_38);
  iVar3 = Imf_3_4::TiledRgbaOutputFile::numYTiles((int)local_38);
  Imf_3_4::TiledRgbaOutputFile::writeTiles((int)local_38,0,iVar2 + -1,0,iVar3 + -1);
  Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)local_38);
  return;
}

Assistant:

void
writeTiledRgbaONE1 (
    const char  fileName[],
    const Rgba* pixels,
    int         width,
    int         height,
    int         tileWidth,
    int         tileHeight)
{
    //
    // Write a tiled image with one level using an image-sized framebuffer.
    //

    TiledRgbaOutputFile out (
        fileName,
        width,
        height, // image size
        tileWidth,
        tileHeight,  // tile size
        ONE_LEVEL,   // level mode
        ROUND_DOWN,  // rounding mode
        WRITE_RGBA); // channels in file

    out.setFrameBuffer (pixels, 1, width);
    out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 1);
}